

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

int sat_solver3_propagate(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  veci *pvVar3;
  char cVar4;
  uint uVar5;
  clause cVar6;
  veci *pvVar7;
  veci *pvVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  clause *pcVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  clause cVar20;
  uint *puVar21;
  bool bVar22;
  
  iVar13 = s->qhead;
  do {
    if (s->qtail <= iVar13) {
      return 0;
    }
    pvVar7 = s->wlists;
    s->qhead = iVar13 + 1;
    uVar5 = s->trail[iVar13];
    puVar15 = (uint *)pvVar7[(int)uVar5].ptr;
    iVar13 = pvVar7[(int)uVar5].size;
    pAVar1 = &(s->stats).propagations;
    *pAVar1 = *pAVar1 + 1;
    if ((long)iVar13 < 1) {
      uVar9 = 0;
    }
    else {
      puVar2 = puVar15 + iVar13;
      cVar20 = (clause)(uVar5 ^ 1);
      uVar9 = 0;
      puVar21 = puVar15;
      do {
        uVar12 = *puVar21;
        if ((uVar12 & 1) == 0) {
          if (uVar12 == 0) {
            puVar19 = (uint *)0x0;
          }
          else {
            uVar11 = (s->Mem).uPageMask & uVar12;
            if (uVar11 == 0) {
              __assert_fail("k",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
            }
            puVar19 = (uint *)((s->Mem).pPages[(int)uVar12 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                              (int)uVar11);
          }
          if (*(clause *)(puVar19 + 1) == cVar20) {
            puVar19[1] = puVar19[2];
            *(clause *)(puVar19 + 2) = cVar20;
          }
          if (*(clause *)(puVar19 + 2) != cVar20) {
            __assert_fail("lits[1] == false_lit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                          ,0x427,"int sat_solver3_propagate(sat_solver3 *)");
          }
          if ((puVar19[1] & 1) == (int)s->assigns[(int)puVar19[1] >> 1]) {
            *puVar15 = *puVar21;
            puVar15 = puVar15 + 1;
          }
          else {
            uVar12 = *puVar19 >> 9 & 0xfffffffc;
            if (8 < uVar12) {
              pcVar14 = (clause *)(puVar19 + 3);
              do {
                cVar6 = *pcVar14;
                if (((uint)cVar6 & 1 ^ (int)s->assigns[(int)cVar6 >> 1]) != 1) {
                  *(clause *)(puVar19 + 2) = cVar6;
                  *pcVar14 = cVar20;
                  uVar16 = (long)(int)puVar19[2] ^ 1;
                  pvVar8 = s->wlists;
                  pvVar3 = pvVar8 + uVar16;
                  uVar12 = *puVar21;
                  uVar11 = pvVar8[uVar16].cap;
                  if (pvVar8[uVar16].size == uVar11) {
                    iVar13 = (uVar11 >> 1) * 3;
                    if ((int)uVar11 < 4) {
                      iVar13 = uVar11 * 2;
                    }
                    if (pvVar3->ptr == (int *)0x0) {
                      piVar10 = (int *)malloc((long)iVar13 << 2);
                    }
                    else {
                      piVar10 = (int *)realloc(pvVar3->ptr,(long)iVar13 << 2);
                    }
                    pvVar3->ptr = piVar10;
                    if (piVar10 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             (double)pvVar3->cap * 9.5367431640625e-07,
                             (double)iVar13 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    pvVar3->cap = iVar13;
                  }
                  iVar13 = pvVar3->size;
                  pvVar3->size = iVar13 + 1;
                  pvVar3->ptr[iVar13] = uVar12;
                  goto LAB_008e016e;
                }
                pcVar14 = pcVar14 + 1;
              } while (pcVar14 < (clause *)((long)puVar19 + (ulong)uVar12 + 4));
            }
            *puVar15 = *puVar21;
            uVar12 = *puVar19;
            if ((uVar12 & 1) != 0) {
              uVar11 = 0;
              if (0x7ff < uVar12) {
                uVar16 = 0;
                uVar11 = 0;
                uVar17 = 0;
                do {
                  uVar18 = 1 << ((byte)s->levels[(int)puVar19[uVar16 + 1] >> 1] & 0x1f);
                  bVar22 = (uVar17 >> (s->levels[(int)puVar19[uVar16 + 1] >> 1] & 0x1fU) & 1) != 0;
                  if (bVar22) {
                    uVar18 = 0;
                  }
                  uVar11 = (uVar11 + 1) - (uint)bVar22;
                  uVar17 = uVar17 | uVar18;
                  uVar16 = uVar16 + 1;
                } while (uVar12 >> 0xb != uVar16);
                uVar11 = (uVar11 & 0xff) << 3;
              }
              *puVar19 = uVar12 & 0xfffff807 | uVar11;
            }
            uVar12 = puVar19[1];
            uVar11 = *puVar21;
            iVar13 = (int)uVar12 >> 1;
            if (s->pFreqs[iVar13] == '\0') {
              s->pFreqs[iVar13] = '\x01';
            }
            puVar15 = puVar15 + 1;
            uVar17 = (uint)s->assigns[iVar13];
            if (uVar17 == 3) {
              s->assigns[iVar13] = (byte)uVar12 & 1;
              s->levels[iVar13] = (s->trail_lim).size;
              s->reasons[iVar13] = uVar11;
              iVar13 = s->qtail;
              s->qtail = iVar13 + 1;
              s->trail[iVar13] = uVar12;
            }
            else if ((uVar12 & 1) != uVar17) {
              uVar9 = *puVar21;
              while (puVar21 = puVar21 + 1, puVar21 < puVar2) {
                *puVar15 = *puVar21;
                puVar15 = puVar15 + 1;
              }
            }
          }
LAB_008e016e:
          puVar21 = puVar21 + 1;
        }
        else {
          cVar4 = s->assigns[(int)uVar12 >> 2];
          uVar11 = uVar12 >> 1 & 1;
          if (uVar11 == (int)cVar4) {
            puVar21 = puVar21 + 1;
            *puVar15 = uVar12;
            puVar15 = puVar15 + 1;
          }
          else {
            *puVar15 = uVar12;
            uVar12 = *puVar21;
            iVar13 = (int)uVar12 >> 2;
            if (s->pFreqs[iVar13] == '\0') {
              s->pFreqs[iVar13] = '\x01';
            }
            puVar15 = puVar15 + 1;
            uVar12 = (int)uVar12 >> 1;
            uVar17 = (uint)s->assigns[iVar13];
            if (uVar17 == 3) {
              s->assigns[iVar13] = (byte)uVar12 & 1;
              s->levels[iVar13] = (s->trail_lim).size;
              s->reasons[iVar13] = uVar5 * 2 + 1;
              iVar13 = s->qtail;
              s->qtail = iVar13 + 1;
              s->trail[iVar13] = uVar12;
            }
            else if ((uVar12 & 1) != uVar17) {
              uVar9 = s->hBinary;
              pcVar14 = s->binary;
              pcVar14[2] = cVar20;
              pcVar14[1] = (clause)((int)*puVar21 >> 1);
              while (puVar21 = puVar21 + 1, puVar21 < puVar2) {
                *puVar15 = *puVar21;
                puVar15 = puVar15 + 1;
              }
            }
          }
          if (uVar11 != (int)cVar4) goto LAB_008e016e;
        }
      } while (puVar21 < puVar2);
    }
    uVar16 = (long)puVar15 - (long)pvVar7[(int)uVar5].ptr;
    pAVar1 = &(s->stats).inspects;
    *pAVar1 = *pAVar1 + ((long)uVar16 >> 2);
    iVar13 = (int)(uVar16 >> 2);
    if (pvVar7[(int)uVar5].size < iVar13) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    pvVar7[(int)uVar5].size = iVar13;
    if (uVar9 != 0) {
      return uVar9;
    }
    iVar13 = s->qhead;
  } while( true );
}

Assistant:

int sat_solver3_propagate(sat_solver3* s)
{
    int     hConfl = 0;
    lit*    lits;
    lit false_lit;

    //printf("sat_solver3_propagate\n");
    while (hConfl == 0 && s->qtail - s->qhead > 0){
        lit p = s->trail[s->qhead++];

#ifdef TEST_CNF_LOAD
        int v = lit_var(p);
        if ( s->pCnfFunc )
        {
            if ( lit_sign(p) )
            {
                if ( (s->loads[v] & 1) == 0 )
                {
                    s->loads[v] ^= 1;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
            else
            {
                if ( (s->loads[v] & 2) == 0 )
                {
                    s->loads[v] ^= 2;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
        }
        {
#endif

        veci* ws    = sat_solver3_read_wlist(s,p);
        int*  begin = veci_begin(ws);
        int*  end   = begin + veci_size(ws);
        int*i, *j;

        s->stats.propagations++;
//        s->simpdb_props--;

        //printf("checking lit %d: "L_LIT"\n", veci_size(ws), L_lit(p));
        for (i = j = begin; i < end; ){
            if (clause_is_lit(*i)){

                int Lit = clause_read_lit(*i);
                if (var_value(s, lit_var(Lit)) == lit_sign(Lit)){
                    *j++ = *i++;
                    continue;
                }

                *j++ = *i;
                if (!sat_solver3_enqueue(s,clause_read_lit(*i),clause_from_lit(p))){
                    hConfl = s->hBinary;
                    (clause_begin(s->binary))[1] = lit_neg(p);
                    (clause_begin(s->binary))[0] = clause_read_lit(*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }else{

                clause* c = clause_read(s,*i);
                lits = clause_begin(c);

                // Make sure the false literal is data[1]:
                false_lit = lit_neg(p);
                if (lits[0] == false_lit){
                    lits[0] = lits[1];
                    lits[1] = false_lit;
                }
                assert(lits[1] == false_lit);

                // If 0th watch is true, then clause is already satisfied.
                if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                    *j++ = *i;
                else{
                    // Look for new watch:
                    lit* stop = lits + clause_size(c);
                    lit* k;
                    for (k = lits + 2; k < stop; k++){
                        if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                            lits[1] = *k;
                            *k = false_lit;
                            veci_push(sat_solver3_read_wlist(s,lit_neg(lits[1])),*i);
                            goto next; }
                    }

                    *j++ = *i;
                    // Clause is unit under assignment:
                    if ( c->lrn )
                        c->lbd = sat_clause_compute_lbd(s, c);
                    if (!sat_solver3_enqueue(s,lits[0], *i)){
                        hConfl = *i++;
                        // Copy the remaining watches:
                        while (i < end)
                            *j++ = *i++;
                    }
                }
            }
        next:
            i++;
        }

        s->stats.inspects += j - veci_begin(ws);
        veci_resize(ws,j - veci_begin(ws));
#ifdef TEST_CNF_LOAD
        }
#endif
    }

    return hConfl;
}